

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Own<capnp::PipelineHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline::addRef
          (PostReturnRpcPipeline *this)

{
  PipelineHook *extraout_RDX;
  PostReturnRpcPipeline *in_RSI;
  Own<capnp::PipelineHook,_std::nullptr_t> OVar1;
  PostReturnRpcPipeline *this_local;
  
  this_local = this;
  kj::addRef<capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline>
            ((kj *)&stack0xffffffffffffffd8,in_RSI);
  kj::Own<capnp::PipelineHook,decltype(nullptr)>::
  Own<capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline,void>
            ((Own<capnp::PipelineHook,decltype(nullptr)> *)this,
             (Own<capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline,_std::nullptr_t>
              *)&stack0xffffffffffffffd8);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline,_std::nullptr_t>::~Own
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline,_std::nullptr_t>
              *)&stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<PipelineHook> addRef() override {
      return kj::addRef(*this);
    }